

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

bool __thiscall spectest::JSONParser::Match(JSONParser *this,char *s)

{
  size_t sVar1;
  char *pcVar2;
  size_type sVar3;
  size_t sVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  Location start_loc;
  
  SkipWhitespace(this);
  pcVar2 = (this->loc_).filename.data_;
  sVar3 = (this->loc_).filename.size_;
  sVar4 = (this->loc_).field_1.field_1.offset;
  uVar5 = *(undefined8 *)((long)&(this->loc_).field_1 + 8);
  cVar6 = *s;
  if (cVar6 != '\0') {
    sVar1 = this->json_offset_;
    pcVar8 = s + 1;
    do {
      iVar7 = ReadChar(this);
      if (iVar7 != cVar6) {
        if (pcVar8[-1] == '\0') {
          return true;
        }
        this->json_offset_ = sVar1;
        (this->loc_).field_1.field_1.offset = sVar4;
        *(undefined8 *)((long)&(this->loc_).field_1 + 8) = uVar5;
        (this->loc_).filename.data_ = pcVar2;
        (this->loc_).filename.size_ = sVar3;
        return false;
      }
      cVar6 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar6 != '\0');
  }
  return true;
}

Assistant:

bool JSONParser::Match(const char* s) {
  SkipWhitespace();
  Location start_loc = loc_;
  size_t start_offset = json_offset_;
  while (*s && *s == ReadChar())
    s++;

  if (*s == 0) {
    return true;
  } else {
    json_offset_ = start_offset;
    loc_ = start_loc;
    return false;
  }
}